

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::VarintTest_TestZigzagToLong_Test::~VarintTest_TestZigzagToLong_Test
          (VarintTest_TestZigzagToLong_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestZigzagToLong)
{
    ASSERT_EQ(0, Varint::ZigzagToLong(0));
    ASSERT_EQ(-1, Varint::ZigzagToLong(1));
    ASSERT_EQ(1, Varint::ZigzagToLong(2));
    ASSERT_EQ(-2, Varint::ZigzagToLong(3));
    ASSERT_EQ(2, Varint::ZigzagToLong(4));
    ASSERT_EQ(-3, Varint::ZigzagToLong(5));
    ASSERT_EQ(3, Varint::ZigzagToLong(6));
    ASSERT_EQ(-4, Varint::ZigzagToLong(7));
    ASSERT_EQ(4, Varint::ZigzagToLong(8));

    ASSERT_EQ(10000000000L, Varint::ZigzagToLong(20000000000L));
    ASSERT_EQ(-10000000000L, Varint::ZigzagToLong(19999999999L));
}